

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8 * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                  (string *str,uint8 *target)

{
  uint uVar1;
  uint uVar2;
  LogMessage *other;
  ulong uVar3;
  ulong uVar4;
  uint8 *__dest;
  uint8 *puVar5;
  size_t __n;
  LogMessage local_60;
  LogFinisher local_21;
  
  uVar4 = str->_M_string_length;
  if (uVar4 >> 0x20 != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/coded_stream.cc"
               ,0x3b5);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (str.size()) <= (kuint32max): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
    uVar4 = str->_M_string_length;
  }
  if ((uint)uVar4 < 0x80) {
    *target = (byte)uVar4;
    __dest = target + 1;
  }
  else {
    *target = (byte)uVar4 | 0x80;
    uVar3 = uVar4 >> 7 & 0x1ffffff;
    if ((uint)uVar4 < 0x4000) {
      target[1] = (uint8)uVar3;
      __dest = target + 2;
    }
    else {
      __dest = target + 2;
      do {
        puVar5 = __dest;
        uVar1 = (uint)uVar3;
        puVar5[-1] = (byte)uVar3 | 0x80;
        uVar2 = uVar1 >> 7;
        uVar3 = (ulong)uVar2;
        __dest = puVar5 + 1;
      } while (0x3fff < uVar1);
      *puVar5 = (uint8)uVar2;
    }
  }
  __n = (size_t)(int)str->_M_string_length;
  memcpy(__dest,(str->_M_dataplus)._M_p,__n);
  return __dest + __n;
}

Assistant:

uint8* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8* target) {
  GOOGLE_DCHECK_LE(str.size(), kuint32max);
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}